

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::ClassType::computeCycles(ClassType *this)

{
  bool bVar1;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> *in_RDI;
  Type *propType;
  ClassPropertySymbol *prop;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __end2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  *__range2;
  uint5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  undefined2 in_stack_ffffffffffffffb6;
  Scope *in_stack_ffffffffffffffc0;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  local_28;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  *local_18;
  undefined1 local_b;
  undefined2 local_a;
  
  Scope::ensureElaborated
            ((Scope *)CONCAT26(in_stack_ffffffffffffffb6,
                               CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)));
  local_b = 1;
  std::optional<bool>::optional<bool,_true>
            ((optional<bool> *)
             CONCAT26(in_stack_ffffffffffffffb6,
                      CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)),(bool *)in_RDI)
  ;
  *(undefined2 *)&in_RDI[0x1e].current = local_a;
  local_28 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(in_stack_ffffffffffffffc0);
  local_18 = &local_28;
  std::ranges::
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  ::begin(local_18);
  std::ranges::
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  ::end(local_18);
  do {
    bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                      ((self_type *)
                       CONCAT26(in_stack_ffffffffffffffb6,
                                CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)),
                       in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::optional<bool>::optional<bool,_true>
                ((optional<bool> *)
                 CONCAT26(in_stack_ffffffffffffffb6,(uint6)in_stack_ffffffffffffffb0),(bool *)in_RDI
                );
      *(undefined2 *)&in_RDI[0x1e].current = in_stack_ffffffffffffffb6;
      return;
    }
    iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
    ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                 *)0x3790eb);
    ValueSymbol::getType((ValueSymbol *)0x3790fa);
    Type::getCanonicalType
              ((Type *)CONCAT26(in_stack_ffffffffffffffb6,
                                CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)));
    bVar1 = Type::isClass((Type *)0x379111);
    if (bVar1) {
      Symbol::as<slang::ast::ClassType>((Symbol *)0x379121);
      bVar1 = hasCycles((ClassType *)
                        CONCAT26(in_stack_ffffffffffffffb6,
                                 CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)));
      if (bVar1) {
        return;
      }
    }
    iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
    ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
              ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                *)CONCAT26(in_stack_ffffffffffffffb6,
                           CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0)));
  } while( true );
}

Assistant:

void ClassType::computeCycles() const {
    // Start out by setting hasCycles to true, so that if we call into
    // hasCycles() in a re-entrant fashion we'll see this result right away.
    ensureElaborated();
    cachedHasCycles = true;

    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        auto& propType = prop.getType().getCanonicalType();
        if (propType.isClass() && propType.as<ClassType>().hasCycles())
            return;
    }

    cachedHasCycles = false;
}